

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_names.cpp
# Opt level: O3

prefix_t * so_5::stats::prefixes::mbox_repository(void)

{
  char cVar1;
  long lVar2;
  prefix_t *in_RDI;
  
  cVar1 = 'm';
  lVar2 = 0;
  do {
    in_RDI->m_value[lVar2] = cVar1;
    cVar1 = "mbox_repository"[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xf);
  in_RDI->m_value[0xf] = '\0';
  return in_RDI;
}

Assistant:

SO_5_FUNC prefix_t
mbox_repository()
	{
		return prefix_t( "mbox_repository" );
	}